

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

bool __thiscall
estl::state_machine<cdplayer>::test_transitions
          (state_machine<cdplayer> *this,test_vec_type *test_vector,bool print_failing)

{
  bool bVar1;
  state_type sVar2;
  size_type sVar3;
  size_t sVar4;
  ostream *poVar5;
  reference ptVar6;
  state_type out_state;
  inputs_type *inputs;
  state_type state_from;
  test_entry *tc;
  const_iterator __end0;
  const_iterator __begin0;
  test_vec_type *__range2;
  bool all_ok;
  bool print_failing_local;
  test_vec_type *test_vector_local;
  state_machine<cdplayer> *this_local;
  
  sVar3 = std::array<estl::state_machine<cdplayer>::switch_entry,_4UL>::size(&this->state_switches_)
  ;
  sVar4 = states_count();
  if (sVar3 == sVar4) {
    this_local._7_1_ = true;
    __end0 = std::
             vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>
             ::begin(test_vector);
    tc = (test_entry *)
         std::
         vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>
         ::end(test_vector);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_estl::state_machine<cdplayer>::test_entry_*,_std::vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>_>
                                       *)&tc), bVar1) {
      ptVar6 = __gnu_cxx::
               __normal_iterator<const_estl::state_machine<cdplayer>::test_entry_*,_std::vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>_>
               ::operator*(&__end0);
      sVar2 = next_state(this,ptVar6->state_from,&ptVar6->inputs);
      if ((sVar2 != ptVar6->state_to) && (this_local._7_1_ = false, print_failing)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"FAILED test: ");
        poVar5 = std::operator<<(poVar5,(string *)&ptVar6->description);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"Expected <> Found: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,ptVar6->state_to);
        poVar5 = std::operator<<(poVar5," != ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<const_estl::state_machine<cdplayer>::test_entry_*,_std::vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>_>
      ::operator++(&__end0);
    }
  }
  else {
    if (print_failing) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ERROR: Wrong number of transition functions:\n");
      poVar5 = std::operator<<(poVar5,"Expected <> Found:\n");
      sVar4 = states_count();
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
      poVar5 = std::operator<<(poVar5," != ");
      sVar3 = std::array<estl::state_machine<cdplayer>::switch_entry,_4UL>::size
                        (&this->state_switches_);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool test_transitions(const test_vec_type& test_vector, bool print_failing = false) const {
        // Test we have transistions for all states
        if (state_switches_.size() != states_count()) {
            if (print_failing) {
                std::cout   << "ERROR: Wrong number of transition functions:\n"
                            << "Expected <> Found:\n"
                            << states_count()
                            << " != " << state_switches_.size()
                            << std::endl;
            }
            return false;
        }

        // Run test cases
        bool all_ok = true;
        for (const test_entry& tc: test_vector) {
            const state_type state_from = tc.state_from;
            const inputs_type& inputs = tc.inputs;
            const auto out_state = next_state(state_from, inputs);
            if (out_state != tc.state_to) {
                all_ok = false;
                if (print_failing) {
                    std::cout   << "FAILED test: " << tc.description << "\n"
                                << "Expected <> Found: "
                                << static_cast<int32_t>(tc.state_to)
                                << " != " << static_cast<int32_t>(out_state)
                                << std::endl;
                }
            }
        }
        return all_ok;
    }